

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass-utils.h
# Opt level: O1

void __thiscall
wasm::PassUtils::FilteredPassRunner::doAdd
          (FilteredPassRunner *this,unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *pass)

{
  FuncSet *pFVar1;
  __uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_> local_28;
  
  pFVar1 = this->relevantFuncs;
  local_28._M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
  super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl =
       (tuple<wasm::Pass_*,_std::default_delete<wasm::Pass>_>)operator_new(0x68);
  *(long *)((long)local_28._M_t.
                  super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                  super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl + 8) = 0;
  *(long **)((long)local_28._M_t.
                   super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                   super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl + 0x10) =
       (long *)((long)local_28._M_t.
                      super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                      super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl + 0x20);
  *(long *)((long)local_28._M_t.
                  super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                  super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl + 0x18) = 0;
  *(undefined1 *)
   ((long)local_28._M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
          super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl + 0x20) = 0;
  *(undefined1 *)
   ((long)local_28._M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
          super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl + 0x50) = 0;
  *(undefined ***)
   local_28._M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
   super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl = &PTR__FilteredPass_01091720;
  *(Pass **)((long)local_28._M_t.
                   super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                   super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl + 0x58) =
       (pass->_M_t).super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>._M_t.
       super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
       super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl;
  (pass->_M_t).super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
  super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl = (Pass *)0x0;
  *(FuncSet **)
   ((long)local_28._M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
          super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl + 0x60) = pFVar1;
  PassRunner::doAdd(&this->super_PassRunner,
                    (unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *)&local_28);
  if ((_Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>)
      local_28._M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
      super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl != (Pass *)0x0) {
    (**(code **)(*(long *)local_28._M_t.
                          super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                          super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl + 8))();
  }
  return;
}

Assistant:

void doAdd(std::unique_ptr<Pass> pass) override {
    PassRunner::doAdd(
      std::make_unique<FilteredPass>(std::move(pass), relevantFuncs));
  }